

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void prvTidyParseSelect(TidyDocImpl *doc,Node *field,GetTokenMode mode)

{
  Dict *pDVar1;
  Node *pNVar2;
  Bool BVar3;
  Node *node;
  Node **ppNVar4;
  
  doc->lexer->insert = (IStack *)0x0;
  node = prvTidyGetToken(doc,IgnoreWhitespace);
  if (node != (Node *)0x0) {
    do {
      if ((node->tag == field->tag) && (node->type == EndTag)) {
        prvTidyFreeNode(doc,node);
        field->closed = yes;
        TrimSpaces(doc,field);
        return;
      }
      BVar3 = InsertMisc(field,node);
      if (BVar3 == no) {
        if (((node->type == StartTag) && (pDVar1 = node->tag, pDVar1 != (Dict *)0x0)) &&
           ((pDVar1->id == TidyTag_OPTION ||
            ((pDVar1 != (Dict *)0x0 &&
             ((pDVar1->id == TidyTag_OPTGROUP ||
              ((pDVar1 != (Dict *)0x0 &&
               ((pDVar1->id == TidyTag_DATALIST ||
                ((pDVar1 != (Dict *)0x0 && (pDVar1->id == TidyTag_SCRIPT)))))))))))))) {
          node->parent = field;
          pNVar2 = field->last;
          node->prev = pNVar2;
          ppNVar4 = &pNVar2->next;
          if (pNVar2 == (Node *)0x0) {
            ppNVar4 = &field->content;
          }
          *ppNVar4 = node;
          field->last = node;
          ParseTag(doc,node,IgnoreWhitespace);
        }
        else {
          prvTidyReport(doc,field,node,0x235);
          prvTidyFreeNode(doc,node);
        }
      }
      node = prvTidyGetToken(doc,IgnoreWhitespace);
    } while (node != (Node *)0x0);
  }
  prvTidyReport(doc,field,(Node *)0x0,0x25a);
  return;
}

Assistant:

void TY_(ParseSelect)(TidyDocImpl* doc, Node *field, GetTokenMode ARG_UNUSED(mode))
{
#if defined(ENABLE_DEBUG_LOG)
    static int in_parse_select = 0;
#endif
    Lexer* lexer = doc->lexer;
    Node *node;

    lexer->insert = NULL;  /* defer implicit inline start tags */
#if defined(ENABLE_DEBUG_LOG)
    in_parse_select++;
    SPRTF("Entering ParseSelect %d...\n",in_parse_select);
#endif

    while ((node = TY_(GetToken)(doc, IgnoreWhitespace)) != NULL)
    {
        if (node->tag == field->tag && node->type == EndTag)
        {
            TY_(FreeNode)( doc, node);
            field->closed = yes;
            TrimSpaces(doc, field);
#if defined(ENABLE_DEBUG_LOG)
            in_parse_select--;
            SPRTF("Exit ParseSelect 1 %d...\n",in_parse_select);
#endif
            return;
        }

        /* deal with comments etc. */
        if (InsertMisc(field, node))
            continue;

        if ( node->type == StartTag && 
             ( nodeIsOPTION(node)   ||
               nodeIsOPTGROUP(node) ||
               nodeIsDATALIST(node) ||
               nodeIsSCRIPT(node)) 
           )
        {
            TY_(InsertNodeAtEnd)(field, node);
            ParseTag(doc, node, IgnoreWhitespace);
            continue;
        }

        /* discard unexpected tags */
        TY_(Report)(doc, field, node, DISCARDING_UNEXPECTED);
        TY_(FreeNode)( doc, node);
    }

    TY_(Report)(doc, field, node, MISSING_ENDTAG_FOR);
#if defined(ENABLE_DEBUG_LOG)
    in_parse_select--;
    SPRTF("Exit ParseSelect 2 %d...\n",in_parse_select);
#endif
}